

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O0

nametree_entry_t *
ndn_nametree_prefix_match
          (ndn_nametree_t *nametree,uint8_t *name,size_t len,NDN_NAMETREE_ENTRY_TYPE type)

{
  ushort uVar1;
  ulong uVar2;
  size_t local_60;
  ulong local_58;
  size_t offset;
  size_t eqiv_component_len;
  size_t component_len;
  int local_38;
  int tmp;
  int father;
  int last_node;
  int now_node;
  NDN_NAMETREE_ENTRY_TYPE type_local;
  size_t len_local;
  uint8_t *name_local;
  ndn_nametree_t *nametree_local;
  
  tmp = 0xffff;
  local_38 = 0;
  if (len < 2) {
    nametree_local = (ndn_nametree_t *)0x0;
  }
  else {
    if (name[1] < 0xfd) {
      local_58 = 2;
    }
    else {
      local_58 = 4;
    }
    for (; local_58 < len; local_58 = uVar2 + local_58) {
      uVar2 = (ulong)(int)(name[local_58 + 1] + 2);
      local_60 = uVar2;
      if (0x23 < uVar2) {
        local_60 = 0x24;
      }
      uVar1 = *(ushort *)(nametree + (long)local_38 * 0x2e + 0x26);
      component_len._4_4_ = -2;
      while ((father = (int)uVar1, father != 0xffff &&
             (component_len._4_4_ = memcmp(name + local_58,nametree + (long)father * 0x2e,local_60),
             0 < component_len._4_4_))) {
        uVar1 = *(ushort *)(nametree + (long)father * 0x2e + 0x28);
      }
      if (component_len._4_4_ != 0) break;
      if ((*(short *)(nametree + (long)father * 0x2e + 0x2c) != -1) &&
         (type == NDN_NAMETREE_FIB_TYPE)) {
        tmp = father;
      }
      if ((*(short *)(nametree + (long)father * 0x2e + 0x2a) != -1) &&
         (type == NDN_NAMETREE_PIT_TYPE)) {
        tmp = father;
      }
      local_38 = father;
    }
    if (tmp == 0xffff) {
      nametree_local = (ndn_nametree_t *)0x0;
    }
    else {
      nametree_local = nametree + (long)tmp * 0x2e;
    }
  }
  return (nametree_entry_t *)nametree_local;
}

Assistant:

nametree_entry_t*
ndn_nametree_prefix_match(
                          ndn_nametree_t* nametree,
                          uint8_t name[],
                          size_t len,
                          enum NDN_NAMETREE_ENTRY_TYPE type)
{
  int now_node, last_node = NDN_INVALID_ID , father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset,(*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp == 0) {
      if ((*nametree)[now_node].fib_id != NDN_INVALID_ID && type == NDN_NAMETREE_FIB_TYPE) last_node = now_node;
      if ((*nametree)[now_node].pit_id != NDN_INVALID_ID && type == NDN_NAMETREE_PIT_TYPE) last_node = now_node;
    } else break;
    offset += component_len;
    father = now_node;
  }
  if (last_node == NDN_INVALID_ID) return NULL; else return &(*nametree)[last_node];
}